

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dds_comp.cpp
# Opt level: O1

void __thiscall crnlib::dds_comp::dds_comp(dds_comp *this)

{
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__dds_comp_001de8e8;
  mipmapped_texture::mipmapped_texture(&this->m_src_tex);
  mipmapped_texture::mipmapped_texture(&this->m_packed_tex);
  *(undefined8 *)&(this->m_comp_data).m_capacity = 0;
  *(undefined8 *)((long)&this->m_pParams + 4) = 0;
  (this->m_comp_data).m_p = (uchar *)0x0;
  (this->m_comp_data).m_size = 0;
  (this->m_comp_data).m_capacity = 0;
  (this->m_pack_params).m_quality = cCRNDXTQualityUber;
  (this->m_pack_params).m_compressor = cCRNDXTCompressorCRN;
  (this->m_pack_params).m_perceptual = true;
  (this->m_pack_params).m_dithering = false;
  (this->m_pack_params).m_grayscale_sampling = false;
  (this->m_pack_params).m_use_both_block_types = true;
  (this->m_pack_params).m_endpoint_caching = true;
  (this->m_pack_params).m_use_transparent_indices_for_black = false;
  (this->m_pack_params).m_pProgress_callback = (progress_callback_func)0x0;
  (this->m_pack_params).m_pProgress_callback_user_data_ptr = (void *)0x0;
  (this->m_pack_params).m_dxt1a_alpha_threshold = 0x80;
  (this->m_pack_params).m_num_helper_threads = 0;
  (this->m_pack_params).m_progress_start = 0;
  (this->m_pack_params).m_progress_range = 100;
  (this->m_pack_params).m_pTask_pool = (task_pool *)0x0;
  task_pool::task_pool(&this->m_task_pool);
  (this->m_q1_params).m_quality_level = 0xff;
  (this->m_q1_params).m_dxt1a_alpha_threshold = 0;
  (this->m_q1_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_q1_params).m_perceptual = true;
  (this->m_q1_params).m_use_alpha_blocks = true;
  (this->m_q1_params).m_hierarchical = true;
  (this->m_q1_params).m_num_mips = 0;
  (this->m_q1_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_q1_params).m_pProgress_data = (void *)0x0;
  memset((this->m_q1_params).m_mip_desc,0,0x600);
  (this->m_q1_params).m_progress_start = 0;
  (this->m_q1_params).m_progress_range = 100;
  (this->m_q5_params).m_quality_level = 0xff;
  (this->m_q5_params).m_dxt_quality = cCRNDXTQualityUber;
  (this->m_q5_params).m_num_mips = 0;
  (this->m_q5_params).m_pProgress_func = (progress_callback_func)0x0;
  (this->m_q5_params).m_pProgress_data = (void *)0x0;
  (this->m_q5_params).m_hierarchical = true;
  memset((this->m_q5_params).m_mip_desc,0,0x600);
  (this->m_q5_params).m_comp_index = 3;
  (this->m_q5_params).m_progress_start = 0;
  (this->m_q5_params).m_progress_range = 100;
  (this->m_q5_params).m_use_both_block_types = true;
  this->m_pQDXT_state = (qdxt_state *)0x0;
  return;
}

Assistant:

dds_comp::dds_comp()
    : m_pParams(NULL),
      m_pixel_fmt(PIXEL_FMT_INVALID),
      m_pQDXT_state(NULL) {
}